

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_queue.cpp
# Opt level: O2

shared_ptr<cppnet::BlockMemoryPool> __thiscall
cppnet::BufferQueue::GetBlockMemoryPool(BufferQueue *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  shared_ptr<cppnet::BlockMemoryPool> sVar1;
  
  std::__shared_ptr<cppnet::BlockMemoryPool,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<cppnet::BlockMemoryPool,_(__gnu_cxx::_Lock_policy)2> *)this,
             (__shared_ptr<cppnet::BlockMemoryPool,_(__gnu_cxx::_Lock_policy)2> *)(in_RSI + 0x48));
  sVar1.super___shared_ptr<cppnet::BlockMemoryPool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<cppnet::BlockMemoryPool,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<cppnet::BlockMemoryPool>)
         sVar1.super___shared_ptr<cppnet::BlockMemoryPool,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<BlockMemoryPool> BufferQueue::GetBlockMemoryPool() {
    return _block_alloter;
}